

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

int eia608_parse_preamble
              (uint16_t cc_data,int *row,int *col,eia608_style_t *style,int *chan,int *underline)

{
  int *underline_local;
  int *chan_local;
  eia608_style_t *style_local;
  int *col_local;
  int *row_local;
  uint16_t cc_data_local;
  
  *row = eia608_row_map[(int)(cc_data & 0x700) >> 7 | (int)(cc_data & 0x20) >> 5];
  *chan = (uint)((cc_data & 0x800) != 0);
  *underline = cc_data & 1;
  if ((cc_data & 0x10) == 0) {
    *style = (int)(cc_data & 0xe) >> 1;
    *col = 0;
  }
  else {
    *style = eia608_style_white;
    *col = ((int)(cc_data & 0xe) >> 1) << 2;
  }
  return 1;
}

Assistant:

int eia608_parse_preamble(uint16_t cc_data, int* row, int* col, eia608_style_t* style, int* chan, int* underline)
{
    (*row) = eia608_row_map[((0x0700 & cc_data) >> 7) | ((0x0020 & cc_data) >> 5)];
    (*chan) = !!(0x0800 & cc_data);
    (*underline) = 0x0001 & cc_data;

    if (0x0010 & cc_data) {
        (*style) = eia608_style_white;
        (*col) = 4 * ((0x000E & cc_data) >> 1);
    } else {
        (*style) = (0x000E & cc_data) >> 1;
        (*col) = 0;
    }

    return 1;
}